

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void tchecker::clockbounds::add_location_constraints
               (typed_expression_t *inv,loc_id_t loc,
               shared_ptr<tchecker::clockbounds::df_solver_t> *solver)

{
  df_solver_expr_updater_t updater;
  undefined **local_30;
  loc_id_t local_28;
  loc_id_t local_24;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_30 = &PTR__df_solver_expr_updater_t_0021d660;
  local_20 = (solver->
             super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_18 = (solver->
             super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_28 = loc;
  local_24 = loc;
  (**(code **)(*(long *)inv + 0x30))(inv,&local_30);
  local_30 = &PTR__df_solver_expr_updater_t_0021d660;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

df_solver_expr_updater_t(tchecker::loc_id_t src, tchecker::loc_id_t tgt,
                           std::shared_ptr<tchecker::clockbounds::df_solver_t> const & solver)
      : _src(src), _tgt(tgt), _solver(solver)
  {
  }